

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# action_score.h
# Opt level: O2

int exploration::generate_epsilon_greedy<ACTION_SCORE::score_iterator>
              (float epsilon,uint top_action,long pdf_first,long pdf_last)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = *(ulong *)(pdf_last + 8);
  uVar2 = *(ulong *)(pdf_first + 8);
  if (uVar2 <= uVar3 && uVar3 - uVar2 != 0) {
    uVar1 = (long)(uVar3 - uVar2) >> 3;
    for (; uVar2 != uVar3; uVar2 = uVar2 + 8) {
      *(float *)(uVar2 + 4) = epsilon / (float)uVar1;
      uVar3 = *(ulong *)(pdf_last + 8);
    }
    uVar3 = (ulong)((int)uVar1 - 1);
    if (top_action < uVar1) {
      uVar3 = (ulong)top_action;
    }
    *(float *)(*(long *)(pdf_first + 8) + 4 + uVar3 * 8) =
         (1.0 - epsilon) + *(float *)(*(long *)(pdf_first + 8) + 4 + uVar3 * 8);
    return 0;
  }
  return 1;
}

Assistant:

size_t operator-(const score_iterator& other) const { return _p - other._p; }